

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.cpp
# Opt level: O3

void __thiscall SpanList::pushFront(SpanList *this,Span *span)

{
  Span *pSVar1;
  Span *pSVar2;
  
  pSVar1 = this->list;
  pSVar2 = span;
  if (pSVar1 != (Span *)0x0) {
    pSVar2 = pSVar1->prev;
    pSVar2->next = span;
    span->prev = pSVar2;
    pSVar2 = pSVar1;
  }
  pSVar2->prev = span;
  this->list = span;
  span->next = pSVar2;
  return;
}

Assistant:

void SpanList::pushFront(Span *span) {
  if (list == nullptr) {
    list = span;
    list->next = list;
    list->prev = list;
  } else {
    list->prev->next = span;
    span->prev = list->prev;
    list->prev = span;
    span->next = list;

    list = span; // 这一步非常重要
  }
}